

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O3

SceneSignal __thiscall StateScene::process(StateScene *this,int state)

{
  pointer pPVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  
  this->state = state;
  if (state == 2) {
    uVar4 = 2;
    uVar2 = 0;
  }
  else {
    if (state == 1) {
      lVar3 = (long)this->selectIndex + (long)this->startIndex;
      pPVar1 = (this->infos).super__Vector_base<PlantInfo,_std::allocator<PlantInfo>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((pPVar1[lVar3].count == 0) && (pPVar1[lVar3].needSunNumber <= this->sunsNumber)) {
        uVar2 = (ulong)(uint)pPVar1[lVar3].type << 0x20;
        uVar4 = 1;
        goto LAB_0010cb15;
      }
    }
    uVar2 = 0;
    uVar4 = 0;
  }
LAB_0010cb15:
  return (SceneSignal)(uVar2 | uVar4);
}

Assistant:

SceneSignal StateScene::process(int state){
	SceneSignal signal(SS_SIGNAL_NULL, 0);
	this->state = state;
	if(state == STATE_NORMAL){

	}
	else if(state == STATE_PLANT){
		int tIdx = startIndex+selectIndex;
		if(infos[tIdx].count==0 && sunsNumber >= infos[tIdx].needSunNumber){
			signal.type = SS_SIGNAL_GEN_PLANT;
			signal.data = infos[tIdx].type;
		}
	}
	else if(state == STATE_REMOVE){
		signal.type = SS_SIGNAL_REMOVE_PLANT; 
	}
	return signal;
}